

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine
          (BuiltStyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  bool bVar2;
  string local_88;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Value *local_18;
  Value *root_local;
  BuiltStyledStreamWriter *this_local;
  
  if (this->cs_ != None) {
    local_18 = root;
    root_local = (Value *)this;
    bVar2 = Value::hasComment(root,commentAfterOnSameLine);
    if (bVar2) {
      poVar1 = (this->super_StreamWriter).sout_;
      Value::getComment_abi_cxx11_(&local_58,local_18,commentAfterOnSameLine);
      std::operator+(&local_38," ",&local_58);
      std::operator<<(poVar1,(string *)&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
    }
    bVar2 = Value::hasComment(local_18,commentAfter);
    if (bVar2) {
      writeIndent(this);
      poVar1 = (this->super_StreamWriter).sout_;
      Value::getComment_abi_cxx11_(&local_88,local_18,commentAfter);
      std::operator<<(poVar1,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine(Value const& root) {
  if (cs_ == CommentStyle::None) return;
  if (root.hasComment(commentAfterOnSameLine))
    *sout_ << " " + root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *sout_ << root.getComment(commentAfter);
  }
}